

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

void CAnonFuncSymtabPrep::enum_for_anon2(void *ctx,CTcSymbol *sym)

{
  long lVar1;
  
  lVar1 = (**(code **)(**ctx + 0x10))
                    (*ctx,(sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.str_,
                     (sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.len_);
  if (lVar1 != 0) {
    (*(sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x14])
              (sym);
    return;
  }
  return;
}

Assistant:

static void enum_for_anon2(void *ctx, CTcSymbol *sym)
    {
        /* get 'this' from the context */
        CAnonFuncSymtabPrep *self = (CAnonFuncSymtabPrep *)ctx;
        
        /*
         *   If this symbol isn't in the anonymous function's local symbol
         *   table, the anonymous function didn't end up using it.  The fact
         *   that it's in the enclosing table in this case simply means that
         *   it's a context variable in the enclosing context.  
         */
        if (self->enc_symtab->find_direct(
            sym->get_sym(), sym->get_sym_len()) == 0)
            return;
        
        /* ask the symbol to apply the necessary conversion */
        sym->finish_ctx_var_conv();
    }